

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sign.c
# Opt level: O3

int wally_s2c_sig_from_bytes
              (uchar *priv_key,size_t priv_key_len,uchar *bytes,size_t bytes_len,uchar *s2c_data,
              size_t s2c_data_len,uint32_t flags,uchar *s2c_opening_out,size_t s2c_opening_out_len,
              uchar *bytes_out,size_t len)

{
  secp256k1_context_struct *ctx;
  int iVar1;
  size_t sVar2;
  int iVar3;
  undefined1 auVar4 [16];
  secp256k1_ecdsa_signature sig_secp;
  secp256k1_ecdsa_s2c_opening local_b0;
  secp256k1_ecdsa_signature local_70;
  
  sVar2 = bytes_len;
  ctx = secp_ctx();
  auVar4._0_4_ = -(uint)(priv_key == (uchar *)0x0);
  auVar4._4_4_ = -(uint)(bytes == (uchar *)0x0);
  auVar4._8_4_ = -(uint)(s2c_data == (uchar *)0x0);
  auVar4._12_4_ = -(uint)(bytes_out == (uchar *)0x0);
  iVar1 = movmskps((int)sVar2,auVar4);
  iVar3 = -2;
  if (((((iVar1 == 0) && (priv_key_len == 0x20)) && (bytes_len == 0x20)) &&
      ((s2c_data_len == 0x20 && (len == 0x40)))) &&
     ((s2c_opening_out_len == 0x21 && ((s2c_opening_out != (uchar *)0x0 && (flags == 1)))))) {
    if (ctx == (secp256k1_context_struct *)0x0) {
      iVar3 = -3;
    }
    else {
      iVar1 = secp256k1_ecdsa_s2c_sign(ctx,&local_70,&local_b0,bytes,priv_key,s2c_data);
      if (iVar1 == 0) {
        wally_clear_2(&local_70,0x40,&local_b0,0x40);
        iVar1 = secp256k1_ec_seckey_verify(ctx,priv_key);
        iVar3 = -1 - (uint)(iVar1 == 0);
      }
      else {
        iVar1 = secp256k1_ecdsa_signature_serialize_compact(ctx,bytes_out,&local_70);
        if (iVar1 == 0) {
          iVar3 = -2;
        }
        else {
          iVar1 = secp256k1_ecdsa_s2c_opening_serialize(ctx,s2c_opening_out,&local_b0);
          iVar3 = (uint)(iVar1 != 0) * 2 + -2;
        }
        wally_clear_2(&local_70,0x40,&local_b0,0x40);
      }
    }
  }
  return iVar3;
}

Assistant:

int wally_s2c_sig_from_bytes(const unsigned char *priv_key, size_t priv_key_len,
                             const unsigned char *bytes, size_t bytes_len,
                             const unsigned char *s2c_data, size_t s2c_data_len,
                             uint32_t flags,
                             unsigned char *s2c_opening_out, size_t s2c_opening_out_len,
                             unsigned char *bytes_out, size_t len)
{
    secp256k1_ecdsa_signature sig_secp;
    secp256k1_ecdsa_s2c_opening opening_secp;
    const secp256k1_context *ctx = secp_ctx();
    bool ok;

    if (!priv_key || priv_key_len != EC_PRIVATE_KEY_LEN ||
        !bytes || bytes_len != EC_MESSAGE_HASH_LEN ||
        !s2c_data || s2c_data_len != WALLY_S2C_DATA_LEN ||
        flags != EC_FLAG_ECDSA ||
        !bytes_out || len != EC_SIGNATURE_LEN ||
        !s2c_opening_out || s2c_opening_out_len != WALLY_S2C_OPENING_LEN)
        return WALLY_EINVAL;

    if (!ctx)
        return WALLY_ENOMEM;

    if (!secp256k1_ecdsa_s2c_sign(ctx, &sig_secp, &opening_secp, bytes, priv_key, s2c_data)) {
        wally_clear_2(&sig_secp, sizeof(sig_secp), &opening_secp, sizeof(opening_secp));
        if (!secp256k1_ec_seckey_verify(ctx, priv_key))
            return WALLY_EINVAL; /* invalid priv_key */
        return WALLY_ERROR;     /* Nonce function failed */
    }

    ok = secp256k1_ecdsa_signature_serialize_compact(ctx, bytes_out, &sig_secp) &&
         secp256k1_ecdsa_s2c_opening_serialize(ctx, s2c_opening_out, &opening_secp);

    wally_clear_2(&sig_secp, sizeof(sig_secp), &opening_secp, sizeof(opening_secp));
    return ok ? WALLY_OK : WALLY_EINVAL;
}